

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O1

bool __thiscall SightCheck::P_SightTraverseIntercepts(SightCheck *this)

{
  double dVar1;
  undefined8 *puVar2;
  AActor *pAVar3;
  extsector_t *peVar4;
  double *pdVar5;
  intercept_t *piVar6;
  bool bVar7;
  intercept_t *piVar8;
  uint uVar9;
  byte bVar10;
  ulong uVar11;
  long lVar12;
  intercept_t *piVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  divline_t dl;
  divline_t local_50;
  
  uVar9 = intercepts.Count;
  if (intercepts.Count != 0) {
    lVar12 = 0;
    uVar11 = 0;
    do {
      piVar13 = intercepts.Array;
      puVar2 = *(undefined8 **)((long)&(intercepts.Array)->d + lVar12);
      local_50.x = *(double *)*puVar2;
      local_50.y = ((double *)*puVar2)[1];
      local_50.dx = (double)puVar2[2];
      local_50.dy = (double)puVar2[3];
      dVar14 = P_InterceptVector(&this->Trace,&local_50);
      *(double *)((long)&piVar13->frac + lVar12) = dVar14;
      if (dVar14 < this->Startfrac) {
        *(undefined8 *)((long)&piVar13->frac + lVar12) = 0x41dfffffffc00000;
        uVar9 = uVar9 - 1;
      }
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x18;
    } while (uVar11 < intercepts.Count);
  }
  if (uVar9 != 0) {
    piVar13 = (intercept_t *)0x0;
    do {
      uVar11 = (ulong)intercepts.Count;
      if (uVar11 != 0) {
        dVar14 = 2147483647.0;
        piVar8 = intercepts.Array;
        do {
          dVar15 = piVar8->frac;
          piVar6 = piVar8;
          if (dVar14 <= piVar8->frac) {
            dVar15 = dVar14;
            piVar6 = piVar13;
          }
          piVar13 = piVar6;
          dVar14 = dVar15;
          piVar8 = piVar8 + 1;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
      }
      if (piVar13 != (intercept_t *)0x0) {
        bVar7 = PTR_SightTraverse(this,piVar13);
        if (!bVar7) {
          return false;
        }
        piVar13->frac = 2147483647.0;
      }
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  pAVar3 = this->seeingthing;
  bVar7 = true;
  if (this->lastsector == (sector_t_conflict *)pAVar3->Sector) {
    peVar4 = this->lastsector->e;
    uVar11 = (ulong)(peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
    if (uVar11 != 0) {
      dVar14 = (this->sightstart).Z;
      dVar15 = this->topslope + dVar14;
      dVar14 = dVar14 + this->bottomslope;
      lVar12 = 0;
      do {
        puVar2 = *(undefined8 **)
                  ((long)(peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array +
                  lVar12);
        uVar9 = *(uint *)(puVar2 + 0xb) & 2;
        bVar10 = 0xb;
        if (((uVar9 != this->myseethrough) && ((*(uint *)(puVar2 + 0xb) & 1) != 0)) &&
           ((uVar9 == 0 & (byte)((this->Flags & 8U) >> 3)) == 0)) {
          pdVar5 = (double *)*puVar2;
          dVar16 = (pAVar3->__Pos).X;
          dVar1 = (pAVar3->__Pos).Y;
          dVar17 = (pdVar5[1] * dVar1 + *pdVar5 * dVar16 + pdVar5[3]) * pdVar5[4];
          if (((dVar17 < this->Lastztop) || (dVar15 <= dVar17)) ||
             ((dVar17 < this->Lastzbottom || (bVar10 = 1, dVar14 <= dVar17)))) {
            pdVar5 = (double *)puVar2[5];
            dVar16 = (dVar1 * pdVar5[1] + dVar16 * *pdVar5 + pdVar5[3]) * pdVar5[4];
            bVar10 = (dVar15 < dVar16 && dVar16 <= this->Lastztop) &
                     -(dVar16 <= this->Lastzbottom) & -(dVar14 < dVar16);
          }
        }
        if ((bVar10 != 0xb) && (bVar10 != 0)) goto LAB_00450abe;
        lVar12 = lVar12 + 8;
      } while (uVar11 << 3 != lVar12);
      bVar10 = 10;
LAB_00450abe:
      bVar7 = bVar10 == 0 || bVar10 == 10;
    }
  }
  return bVar7;
}

Assistant:

bool SightCheck::P_SightTraverseIntercepts ()
{
	unsigned count;
	double dist;
	intercept_t *scan, *in;
	unsigned scanpos;
	divline_t dl;

	count = intercepts.Size ();
//
// calculate intercept distance
//
	for (scanpos = 0; scanpos < intercepts.Size (); scanpos++)
	{
		scan = &intercepts[scanpos];
		P_MakeDivline (scan->d.line, &dl);
		scan->frac = P_InterceptVector (&Trace, &dl);
		if (scan->frac < Startfrac)
		{
			scan->frac = INT_MAX;
			count--;
		}
	}

//
// go through in order
// proper order is needed to handle 3D floors and portals.
//
	in = NULL;

	while (count--)
	{
		dist = INT_MAX;
		for (scanpos = 0; scanpos < intercepts.Size (); scanpos++)
		{
			scan = &intercepts[scanpos];
			if (scan->frac < dist)
			{
				dist = scan->frac;
				in = scan;
			}
		}

		if (in != NULL)
		{
			if (!PTR_SightTraverse (in))
				return false;					// don't bother going farther
			in->frac = INT_MAX;
		}
	}

	if (lastsector == seeingthing->Sector && lastsector->e->XFloor.ffloors.Size())
	{
		// we must do one last check whether the trace has crossed a 3D floor in the last sector

		double topz = topslope + sightstart.Z;
		double bottomz = bottomslope + sightstart.Z;

		for (auto rover : lastsector->e->XFloor.ffloors)
		{
			if ((rover->flags & FF_SOLID) == myseethrough || !(rover->flags & FF_EXISTS)) continue;
			if ((Flags & SF_IGNOREWATERBOUNDARY) && (rover->flags & FF_SOLID) == 0) continue;

			double ff_bottom = rover->bottom.plane->ZatPoint(seeingthing);
			double ff_top = rover->top.plane->ZatPoint(seeingthing);

			if (Lastztop <= ff_bottom && topz > ff_bottom && Lastzbottom <= ff_bottom && bottomz > ff_bottom) return false;
			if (Lastzbottom >= ff_top && bottomz < ff_top && Lastztop >= ff_top && topz < ff_top) return false;
		}
	}
	return true;			// everything was traversed
}